

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# product_fe_space_factory.h
# Opt level: O3

shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> __thiscall
projects::dpg::ProductUniformFESpaceFactory<double>::ReferenceFiniteElement
          (ProductUniformFESpaceFactory<double> *this,RefEl ref_el,size_type degree)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  ostream *poVar4;
  undefined4 in_ECX;
  undefined **ppuVar5;
  undefined **ppuVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> sVar7;
  stringstream ss;
  RefEl local_211;
  string local_210;
  string local_1f0;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  local_211.type_ = (RefElType)degree;
  switch(degree & 0xff) {
  case 1:
    peVar3 = (element_type *)operator_new(0x20);
    peVar3[1]._vptr_Mesh = (_func_int **)0x100000001;
    peVar3->_vptr_Mesh = (_func_int **)&PTR___Sp_counted_ptr_inplace_003fd400;
    ppuVar6 = &PTR__ScalarReferenceFiniteElement_003fd450;
    peVar3[2]._vptr_Mesh = (_func_int **)&PTR__ScalarReferenceFiniteElement_003fd450;
    *(undefined4 *)&peVar3[3]._vptr_Mesh = in_ECX;
    goto LAB_00173632;
  case 2:
    switch(in_ECX) {
    case 0:
      peVar3 = (element_type *)operator_new(0x18);
      peVar3[1]._vptr_Mesh = (_func_int **)0x100000001;
      peVar3->_vptr_Mesh = (_func_int **)&PTR___Sp_counted_ptr_inplace_003fd238;
      ppuVar5 = &PTR__ScalarReferenceFiniteElement_003fb618;
      ppuVar6 = (undefined **)extraout_RDX_01;
      break;
    case 1:
      peVar3 = (element_type *)operator_new(0x18);
      peVar3[1]._vptr_Mesh = (_func_int **)0x100000001;
      peVar3->_vptr_Mesh = (_func_int **)&PTR___Sp_counted_ptr_inplace_003fd288;
      ppuVar5 = &PTR__ScalarReferenceFiniteElement_003fd2d8;
      ppuVar6 = (undefined **)extraout_RDX_10;
      break;
    case 2:
      peVar3 = (element_type *)operator_new(0x18);
      peVar3[1]._vptr_Mesh = (_func_int **)0x100000001;
      peVar3->_vptr_Mesh = (_func_int **)&PTR___Sp_counted_ptr_inplace_003fd360;
      ppuVar5 = &PTR__ScalarReferenceFiniteElement_003fd158;
      ppuVar6 = (undefined **)extraout_RDX_06;
      break;
    case 3:
      peVar3 = (element_type *)operator_new(0x18);
      peVar3[1]._vptr_Mesh = (_func_int **)0x100000001;
      peVar3->_vptr_Mesh = (_func_int **)&PTR___Sp_counted_ptr_inplace_003fd3b0;
      ppuVar5 = &PTR__ScalarReferenceFiniteElement_003fbcf8;
      ppuVar6 = (undefined **)extraout_RDX_09;
      break;
    default:
      std::__cxx11::stringstream::stringstream(local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"no fe of degree ",0x10);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"available on ref_el ",0x14);
      lf::base::operator<<(poVar4,&local_211);
      paVar1 = &local_1f0.field_2;
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"false","");
      paVar2 = &local_210.field_2;
      local_210._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_210,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/test/../product_fe_space_factory.h"
                 ,"");
      std::__cxx11::stringbuf::str();
      lf::base::AssertionFailed(&local_1f0,&local_210,0xce,&local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"false","");
      local_210._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_210,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/test/../product_fe_space_factory.h"
                 ,"");
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
      lf::base::AssertionFailed(&local_1f0,&local_210,0xce,&local_1d0);
      goto LAB_00173799;
    }
    break;
  case 3:
    switch(in_ECX) {
    case 0:
      peVar3 = (element_type *)operator_new(0x18);
      peVar3[1]._vptr_Mesh = (_func_int **)0x100000001;
      peVar3->_vptr_Mesh = (_func_int **)&PTR___Sp_counted_ptr_inplace_003fcd08;
      ppuVar5 = &PTR__ScalarReferenceFiniteElement_003fb4f8;
      ppuVar6 = (undefined **)extraout_RDX;
      break;
    case 1:
      peVar3 = (element_type *)operator_new(0x18);
      peVar3[1]._vptr_Mesh = (_func_int **)0x100000001;
      peVar3->_vptr_Mesh = (_func_int **)&PTR___Sp_counted_ptr_inplace_003fcd58;
      ppuVar5 = &PTR__ScalarReferenceFiniteElement_003fcda8;
      ppuVar6 = (undefined **)extraout_RDX_05;
      break;
    case 2:
      peVar3 = (element_type *)operator_new(0x18);
      peVar3[1]._vptr_Mesh = (_func_int **)0x100000001;
      peVar3->_vptr_Mesh = (_func_int **)&PTR___Sp_counted_ptr_inplace_003fce30;
      ppuVar5 = &PTR__ScalarReferenceFiniteElement_003fce80;
      ppuVar6 = (undefined **)extraout_RDX_02;
      break;
    case 3:
      peVar3 = (element_type *)operator_new(0x18);
      peVar3[1]._vptr_Mesh = (_func_int **)0x100000001;
      peVar3->_vptr_Mesh = (_func_int **)&PTR___Sp_counted_ptr_inplace_003fcf08;
      ppuVar5 = &PTR__ScalarReferenceFiniteElement_003fbb98;
      ppuVar6 = (undefined **)extraout_RDX_03;
      break;
    default:
      std::__cxx11::stringstream::stringstream(local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"no fe of degree ",0x10);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," available on ref_el ",0x15);
      lf::base::operator<<(poVar4,&local_211);
      paVar1 = &local_1f0.field_2;
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"false","");
      paVar2 = &local_210.field_2;
      local_210._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_210,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/test/../product_fe_space_factory.h"
                 ,"");
      std::__cxx11::stringbuf::str();
      lf::base::AssertionFailed(&local_1f0,&local_210,0xae,&local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"false","");
      local_210._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_210,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/test/../product_fe_space_factory.h"
                 ,"");
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
      lf::base::AssertionFailed(&local_1f0,&local_210,0xae,&local_1d0);
      goto LAB_00173799;
    }
    break;
  case 4:
    switch(in_ECX) {
    case 0:
      peVar3 = (element_type *)operator_new(0x18);
      peVar3[1]._vptr_Mesh = (_func_int **)0x100000001;
      peVar3->_vptr_Mesh = (_func_int **)&PTR___Sp_counted_ptr_inplace_003fcf58;
      ppuVar5 = &PTR__ScalarReferenceFiniteElement_003fb590;
      ppuVar6 = (undefined **)extraout_RDX_00;
      break;
    case 1:
      peVar3 = (element_type *)operator_new(0x18);
      peVar3[1]._vptr_Mesh = (_func_int **)0x100000001;
      peVar3->_vptr_Mesh = (_func_int **)&PTR___Sp_counted_ptr_inplace_003fcfa8;
      ppuVar5 = &PTR__ScalarReferenceFiniteElement_003fcff8;
      ppuVar6 = (undefined **)extraout_RDX_08;
      break;
    case 2:
      peVar3 = (element_type *)operator_new(0x18);
      peVar3[1]._vptr_Mesh = (_func_int **)0x100000001;
      peVar3->_vptr_Mesh = (_func_int **)&PTR___Sp_counted_ptr_inplace_003fd080;
      ppuVar5 = &PTR__ScalarReferenceFiniteElement_003fd0d0;
      ppuVar6 = (undefined **)extraout_RDX_04;
      break;
    case 3:
      peVar3 = (element_type *)operator_new(0x18);
      peVar3[1]._vptr_Mesh = (_func_int **)0x100000001;
      peVar3->_vptr_Mesh = (_func_int **)&PTR___Sp_counted_ptr_inplace_003fd1e8;
      ppuVar5 = &PTR__ScalarReferenceFiniteElement_003fbc70;
      ppuVar6 = (undefined **)extraout_RDX_07;
      break;
    default:
      std::__cxx11::stringstream::stringstream(local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"no fe of degree ",0x10);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"available on ref_el ",0x14);
      lf::base::operator<<(poVar4,&local_211);
      paVar1 = &local_1f0.field_2;
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"false","");
      paVar2 = &local_210.field_2;
      local_210._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_210,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/test/../product_fe_space_factory.h"
                 ,"");
      std::__cxx11::stringbuf::str();
      lf::base::AssertionFailed(&local_1f0,&local_210,0xbe,&local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"false","");
      local_210._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_210,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/test/../product_fe_space_factory.h"
                 ,"");
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
      lf::base::AssertionFailed(&local_1f0,&local_210,0xbe,&local_1d0);
      goto LAB_00173799;
    }
    break;
  default:
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,"unsupported reference element ",0x1e);
    lf::base::operator<<(local_1a0,&local_211);
    paVar1 = &local_1f0.field_2;
    local_1f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"false","");
    paVar2 = &local_210.field_2;
    local_210._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/test/../product_fe_space_factory.h"
               ,"");
    std::__cxx11::stringbuf::str();
    lf::base::AssertionFailed(&local_1f0,&local_210,0xd5,&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    local_1f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"false","");
    local_210._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/test/../product_fe_space_factory.h"
               ,"");
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
    lf::base::AssertionFailed(&local_1f0,&local_210,0xd5,&local_1d0);
LAB_00173799:
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1f0);
    abort();
  }
  peVar3[2]._vptr_Mesh = (_func_int **)ppuVar5;
LAB_00173632:
  this->_vptr_ProductUniformFESpaceFactory = (_func_int **)(peVar3 + 2);
  (this->mesh_p_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar3;
  sVar7.
  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar6;
  sVar7.
  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>)
         sVar7.
         super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<const lf::fe::ScalarReferenceFiniteElement<SCALAR>>
ProductUniformFESpaceFactory<SCALAR>::ReferenceFiniteElement(
    lf::base::RefEl ref_el, size_type degree) {
  switch (ref_el) {
    case (lf::base::RefEl::kTria()): {
      switch (degree) {
        case (0):
          return std::make_shared<FeDiscontinuousO0Tria<SCALAR>>();
        case (1):
          return std::make_shared<lf::uscalfe::FeLagrangeO1Tria<SCALAR>>();
        case (2):
          return std::make_shared<lf::uscalfe::FeLagrangeO2Tria<SCALAR>>();
        case (3):
          return std::make_shared<lf::uscalfe::FeLagrangeO3Tria<SCALAR>>();
        default:
          LF_ASSERT_MSG(false, "no fe of degree " << degree
                                                  << " available on ref_el "
                                                  << ref_el);
      }
    }
    case (lf::base::RefEl::kQuad()): {
      switch (degree) {
        case (0):
          return std::make_shared<FeDiscontinuousO0Quad<SCALAR>>();
        case (1):
          return std::make_shared<lf::uscalfe::FeLagrangeO1Quad<SCALAR>>();
        case (2):
          return std::make_shared<lf::uscalfe::FeLagrangeO2Quad<SCALAR>>();
        case (3):
          return std::make_shared<lf::uscalfe::FeLagrangeO3Quad<SCALAR>>();
        default:
          LF_ASSERT_MSG(false, "no fe of degree " << degree
                                                  << "available on ref_el "
                                                  << ref_el);
      }
    }
    case (lf::base::RefEl::kSegment()): {
      switch (degree) {
        case (0):
          return std::make_shared<FeDiscontinuousO0Segment<SCALAR>>();
        case (1):
          return std::make_shared<lf::uscalfe::FeLagrangeO1Segment<SCALAR>>();
        case (2):
          return std::make_shared<lf::uscalfe::FeLagrangeO2Segment<SCALAR>>();
        case (3):
          return std::make_shared<lf::uscalfe::FeLagrangeO3Segment<SCALAR>>();
        default:
          LF_ASSERT_MSG(false, "no fe of degree " << degree
                                                  << "available on ref_el "
                                                  << ref_el);
      }
    }
    case (lf::base::RefEl::kPoint()): {
      return std::make_shared<lf::fe::FePoint<SCALAR>>(degree);
    }
    default: {
      LF_ASSERT_MSG(false, "unsupported reference element " << ref_el);
      return nullptr;
    }
  }
}